

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
AddressFixture_InitSegment0Offset1_Test::~AddressFixture_InitSegment0Offset1_Test
          (AddressFixture_InitSegment0Offset1_Test *this)

{
  AddressFixture_InitSegment0Offset1_Test *this_local;
  
  ~AddressFixture_InitSegment0Offset1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (AddressFixture, InitSegment0Offset1) {
    constexpr auto segment = pstore::address::segment_type{0};
    constexpr auto offset = pstore::address::offset_type{1};

    auto const expected = this->expected_address (segment, offset);
    auto const actual = pstore::address{segment, offset};

    EXPECT_EQ (expected, actual);
    EXPECT_EQ (expected.absolute (), actual.absolute ());
    EXPECT_EQ (segment, actual.segment ());
    EXPECT_EQ (offset, actual.offset ());
}